

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void dec_build_inter_predictor
               (AV1_COMMON *cm,DecoderCodingBlock *dcb,int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  AV1_COMMON *in_RDI;
  BUFFER_SET ctx;
  int mi_y;
  int mi_x;
  int plane;
  int num_planes;
  MACROBLOCKD *xd;
  int in_stack_0000bf9c;
  BUFFER_SET *in_stack_0000bfa0;
  int in_stack_0000bfac;
  uint8_t *in_stack_0000bfb0;
  MACROBLOCKD *in_stack_0000bfb8;
  AV1_COMMON *in_stack_0000bfc0;
  BLOCK_SIZE in_stack_0000bfd0;
  undefined4 in_stack_ffffffffffffff94;
  undefined8 in_stack_ffffffffffffffa8;
  MB_MODE_INFO *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_30;
  int in_stack_ffffffffffffffe0;
  long lVar3;
  
  lVar3 = in_RSI;
  iVar1 = av1_num_planes(in_RDI);
  local_30 = 0;
  while ((local_30 < iVar1 && ((local_30 == 0 || ((*(byte *)(in_RSI + 0xc) & 1) != 0))))) {
    iVar2 = in_ECX << 2;
    dec_build_inter_predictors
              ((AV1_COMMON *)CONCAT44(iVar2,in_EDX << 2),
               (DecoderCodingBlock *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,
               (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(int)in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffe0,in_ECX,(int)lVar3);
    iVar2 = is_interintra_pred((MB_MODE_INFO *)CONCAT44(in_stack_ffffffffffffff94,iVar2));
    if (iVar2 != 0) {
      in_stack_ffffffffffffffa8 = *(undefined8 *)(in_RSI + 0xa50);
      in_stack_ffffffffffffffb0 = *(MB_MODE_INFO **)(in_RSI + 0x1480);
      in_stack_ffffffffffffffbc = *(int *)(in_RSI + 0xa68);
      in_stack_ffffffffffffffc0 = *(undefined4 *)(in_RSI + 0x1498);
      av1_build_interintra_predictor
                (in_stack_0000bfc0,in_stack_0000bfb8,in_stack_0000bfb0,in_stack_0000bfac,
                 in_stack_0000bfa0,in_stack_0000bf9c,in_stack_0000bfd0);
    }
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

static inline void dec_build_inter_predictor(const AV1_COMMON *cm,
                                             DecoderCodingBlock *dcb,
                                             int mi_row, int mi_col,
                                             BLOCK_SIZE bsize) {
  MACROBLOCKD *const xd = &dcb->xd;
  const int num_planes = av1_num_planes(cm);
  for (int plane = 0; plane < num_planes; ++plane) {
    if (plane && !xd->is_chroma_ref) break;
    const int mi_x = mi_col * MI_SIZE;
    const int mi_y = mi_row * MI_SIZE;
    dec_build_inter_predictors(cm, dcb, plane, xd->mi[0], 0,
                               xd->plane[plane].width, xd->plane[plane].height,
                               mi_x, mi_y);
    if (is_interintra_pred(xd->mi[0])) {
      BUFFER_SET ctx = { { xd->plane[0].dst.buf, xd->plane[1].dst.buf,
                           xd->plane[2].dst.buf },
                         { xd->plane[0].dst.stride, xd->plane[1].dst.stride,
                           xd->plane[2].dst.stride } };
      av1_build_interintra_predictor(cm, xd, xd->plane[plane].dst.buf,
                                     xd->plane[plane].dst.stride, &ctx, plane,
                                     bsize);
    }
  }
}